

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi-timeout.c
# Opt level: O3

void lws_sul_wsitimeout_cb(lws_sorted_usec_list_t *sul)

{
  lws *wsi;
  byte *pbVar1;
  undefined8 in_RAX;
  uint uVar2;
  
  wsi = (lws *)(sul + -6);
  uVar2 = (uint)*(char *)((long)&sul[0xc].cb + 4);
  if (uVar2 != 0x20) {
    _lws_log(8,"wsi %p: TIMEDOUT WAITING on %d (did hdr %d, ah %p, wl %d)\n",wsi,(ulong)uVar2,
             (ulong)(*(uint *)((long)&sul[0xc].list.next + 4) & 1),sul[-6].us,
             CONCAT44((int)((ulong)in_RAX >> 0x20),
                      *(undefined4 *)
                       (sul[6].cb + (long)*(char *)((long)&sul[0xc].cb + 5) * 0x188 + 0x2e0)));
    if (*(char *)((long)&sul[0xc].cb + 4) == '\x0f') goto LAB_0011654d;
  }
  pbVar1 = (byte *)((long)&sul[0xc].list.next + 5);
  *pbVar1 = *pbVar1 | 0x10;
LAB_0011654d:
  if (*(short *)((long)&sul[0xb].cb + 4) == 0x204) {
    lws_inform_client_conn_fail(wsi,"Timed out waiting SSL",0x15);
  }
  __lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"timeout");
  return;
}

Assistant:

static void
lws_sul_wsitimeout_cb(lws_sorted_usec_list_t *sul)
{
	struct lws *wsi = lws_container_of(sul, struct lws, sul_timeout);
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];

	if (wsi->pending_timeout != PENDING_TIMEOUT_USER_OK)
		lws_stats_bump(pt, LWSSTATS_C_TIMEOUTS, 1);

	/* no need to log normal idle keepalive timeout */
//		if (wsi->pending_timeout != PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE)
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	if (wsi->pending_timeout != PENDING_TIMEOUT_USER_OK)
		lwsl_info("wsi %p: TIMEDOUT WAITING on %d "
			  "(did hdr %d, ah %p, wl %d)\n",
			  (void *)wsi, wsi->pending_timeout,
			  wsi->hdr_parsing_completed, wsi->http.ah,
			  pt->http.ah_wait_list_length);
#if defined(LWS_WITH_CGI)
	if (wsi->http.cgi)
		lwsl_notice("CGI timeout: %s\n", wsi->http.cgi->summary);
#endif
#else
	if (wsi->pending_timeout != PENDING_TIMEOUT_USER_OK)
		lwsl_info("wsi %p: TIMEDOUT WAITING on %d ", (void *)wsi,
				wsi->pending_timeout);
#endif
	/* cgi timeout */
	if (wsi->pending_timeout != PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE)
		/*
		 * Since he failed a timeout, he already had a chance to
		 * do something and was unable to... that includes
		 * situations like half closed connections.  So process
		 * this "failed timeout" close as a violent death and
		 * don't try to do protocol cleanup like flush partials.
		 */
		wsi->socket_is_permanently_unusable = 1;
#if defined(LWS_WITH_CLIENT)
	if (lwsi_state(wsi) == LRS_WAITING_SSL)
		lws_inform_client_conn_fail(wsi,
			(void *)"Timed out waiting SSL", 21);
#endif

	__lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "timeout");
}